

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O2

bool __thiscall
iutest::floating_point<long_double>::AlmostEquals(floating_point<long_double> *this,_Myt *rhs)

{
  ulong uVar1;
  undefined1 v [16];
  undefined1 v_00 [16];
  UInt *pUVar2;
  UInt *pUVar3;
  ulong uVar4;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  
  if (((~*(uint *)((long)&this->m_v + 8) & 0x7fff) != 0 ||
       ((undefined1  [16])this->m_v & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0
      ) && ((~*(uint *)((long)&rhs->m_v + 8) & 0x7fff) != 0 ||
            ((undefined1  [16])rhs->m_v & (undefined1  [16])0x7fffffffffffffff) ==
            (undefined1  [16])0x0)) {
    v._8_8_ = unaff_R14;
    v._0_8_ = unaff_RBX;
    pUVar2 = norm(*(UInt **)&this->m_v,(UInt)v);
    v_00._8_8_ = unaff_R14;
    v_00._0_8_ = unaff_RBX;
    pUVar3 = norm(*(UInt **)&rhs->m_v,(UInt)v_00);
    uVar4 = (long)pUVar3 - (long)pUVar2;
    uVar1 = (extraout_RDX_00 - extraout_RDX) - (ulong)(pUVar3 < pUVar2);
    if (extraout_RDX_00 < extraout_RDX || extraout_RDX_00 - extraout_RDX < (ulong)(pUVar3 < pUVar2))
    {
      uVar4 = (long)pUVar2 - (long)pUVar3;
      uVar1 = (extraout_RDX - extraout_RDX_00) - (ulong)(pUVar2 < pUVar3);
    }
    return uVar1 < (uVar4 < 5);
  }
  return false;
}

Assistant:

UInt    exponent_bits() const { return m_v.uv & kExpMask; }